

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBlob.h
# Opt level: O1

STBlob * __thiscall jbcoin::STBlob::operator=(STBlob *this,Slice *slice)

{
  uint8_t *__src;
  ulong __n;
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  _Head_base<0UL,_unsigned_char_*,_false> __dest;
  
  __src = slice->data_;
  __n = slice->size_;
  if (__n == 0) {
    __dest._M_head_impl = (uchar *)0x0;
  }
  else {
    __dest._M_head_impl = (uchar *)operator_new__(__n);
    memcpy(__dest._M_head_impl,__src,__n);
  }
  _Var1._M_head_impl =
       (this->value_).p_._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (this->value_).p_._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
  ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __dest._M_head_impl;
  if (_Var1._M_head_impl != (uchar *)0x0) {
    operator_delete__(_Var1._M_head_impl);
  }
  (this->value_).size_ = __n;
  return this;
}

Assistant:

STBlob&
    operator= (Slice const& slice)
    {
        value_ = Buffer(slice.data(), slice.size());
        return *this;
    }